

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# etdc.c
# Opt level: O1

int etdc_encode(etdc_table **table,uint *input,int size,uchar *output)

{
  int iVar1;
  UT_hash_table *pUVar2;
  int iVar3;
  uchar *t;
  uint uVar4;
  ulong uVar5;
  UT_hash_handle *pUVar6;
  long lVar7;
  uint uVar8;
  uint uVar9;
  long lVar10;
  uint uVar11;
  
  iVar3 = (int)output;
  if (0 < size) {
    uVar5 = 0;
    do {
      if (*table == (etdc_table *)0x0) {
LAB_0010189e:
        lVar7 = 0;
      }
      else {
        uVar8 = *(char *)((long)input + uVar5 * 4 + 1) * 0x100 +
                *(char *)((long)input + uVar5 * 4 + 2) * 0x10000 +
                (uint)*(byte *)((long)input + uVar5 * 4 + 3) * 0x1000000 + (int)(char)input[uVar5] +
                0x112410d ^ 0x7f76d;
        uVar4 = uVar8 << 8 ^ 0x9f49bac6 - uVar8;
        uVar9 = uVar4 >> 0xd ^ (-0x112410d - uVar8) - uVar4;
        uVar11 = uVar9 >> 0xc ^ (uVar8 - uVar4) - uVar9;
        uVar8 = uVar11 << 0x10 ^ (uVar4 - uVar9) - uVar11;
        uVar4 = uVar8 >> 5 ^ (uVar9 - uVar11) - uVar8;
        uVar9 = uVar4 >> 3 ^ (uVar11 - uVar8) - uVar4;
        uVar8 = uVar9 << 10 ^ (uVar8 - uVar4) - uVar9;
        pUVar2 = ((*table)->hh).tbl;
        pUVar6 = pUVar2->buckets[pUVar2->num_buckets - 1 & (uVar8 >> 0xf ^ uVar4 - (uVar9 + uVar8))]
                 .hh_head;
        while( true ) {
          if (pUVar6 == (UT_hash_handle *)0x0) {
            lVar7 = 0;
          }
          else {
            lVar7 = (long)pUVar6 - pUVar2->hho;
          }
          if (lVar7 == 0) goto LAB_0010189e;
          if ((*(int *)(lVar7 + 0x48) == 4) && (**(uint **)(lVar7 + 0x40) == input[uVar5])) break;
          pUVar6 = *(UT_hash_handle **)(lVar7 + 0x38);
        }
      }
      iVar1 = *(int *)(lVar7 + 0x10);
      if (0 < iVar1) {
        lVar10 = 0;
        do {
          output[lVar10] = *(uchar *)(lVar7 + 8 + lVar10);
          lVar10 = lVar10 + 1;
        } while (iVar1 != (int)lVar10);
        output = output + lVar10;
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 != (uint)size);
  }
  return (int)output - iVar3;
}

Assistant:

int etdc_encode(struct etdc_table **table, unsigned int *input, int size, unsigned char *output) {
  int i,ts;
  struct etdc_table *e;
  int k;

  unsigned char *t;
  unsigned char *f;

  t = output;

  for (i = 0; i < size; i++) {
    HASH_FIND_INT( *table, &input[i], e);
    //printf("encoding i: %d -> %u -> ", i ,input[i]);
    ts = e->size;

    f = (unsigned char *) &e->code;

    for(k=0; k < ts; k++) {
      //printf("%u ", *f);
      *(t++) = *(f++);
    }
    //printf("\n");
    /*
    int t;
    printf("%u ->", input[i]);
    for(t=0; t<ts; t++) printf(" %u", output[j+t]);
    printf("\n");
    */

  }
  return (t - output);
}